

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseAssignment(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  LexemeType type;
  uint uVar2;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  ParseContext *pPVar5;
  SynBase *local_50;
  SynBase *rhs_1;
  InplaceStr name;
  SynBase *pSStack_30;
  SynModifyAssignType modifyType;
  SynBase *rhs;
  Lexeme *pos;
  SynBase *lhs;
  ParseContext *ctx_local;
  
  ctx_local = (ParseContext *)ParseTernaryExpr(ctx);
  if (ctx_local == (ParseContext *)0x0) {
    ctx_local = (ParseContext *)0x0;
  }
  else {
    begin = ctx->currentLexeme;
    bVar1 = ParseContext::Consume(ctx,lex_set);
    if (bVar1) {
      pSStack_30 = ParseAssignment(ctx);
      if (pSStack_30 == (SynBase *)0x0) {
        pLVar3 = ParseContext::Current(ctx);
        anon_unknown.dwarf_104b6::Report(ctx,pLVar3,"ERROR: expression not found after \'=\'");
        pSStack_30 = &ParseContext::get<SynError>(ctx)->super_SynBase;
        pLVar3 = ParseContext::Current(ctx);
        pLVar4 = ParseContext::Current(ctx);
        SynError::SynError((SynError *)pSStack_30,pLVar3,pLVar4);
      }
      pPVar5 = (ParseContext *)ParseContext::get<SynAssignment>(ctx);
      pLVar3 = ParseContext::Previous(ctx);
      SynAssignment::SynAssignment
                ((SynAssignment *)pPVar5,begin,pLVar3,(SynBase *)ctx_local,pSStack_30);
      ctx_local = pPVar5;
    }
    else {
      type = ParseContext::Peek(ctx);
      name.end._4_4_ = GetModifyAssignType(type);
      if (name.end._4_4_ != SYN_MODIFY_ASSIGN_UNKNOWN) {
        _rhs_1 = ParseContext::Consume(ctx);
        local_50 = ParseAssignment(ctx);
        if (local_50 == (SynBase *)0x0) {
          pLVar3 = ParseContext::Current(ctx);
          uVar2 = InplaceStr::length((InplaceStr *)&rhs_1);
          anon_unknown.dwarf_104b6::Report
                    (ctx,pLVar3,"ERROR: expression not found after \'%.*s\' operator",(ulong)uVar2,
                     rhs_1);
          local_50 = &ParseContext::get<SynError>(ctx)->super_SynBase;
          pLVar3 = ParseContext::Current(ctx);
          pLVar4 = ParseContext::Current(ctx);
          SynError::SynError((SynError *)local_50,pLVar3,pLVar4);
        }
        pPVar5 = (ParseContext *)ParseContext::get<SynModifyAssignment>(ctx);
        pLVar3 = ParseContext::Previous(ctx);
        SynModifyAssignment::SynModifyAssignment
                  ((SynModifyAssignment *)pPVar5,begin,pLVar3,name.end._4_4_,(SynBase *)ctx_local,
                   local_50);
        ctx_local = pPVar5;
      }
    }
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseAssignment(ParseContext &ctx)
{
	if(SynBase *lhs = ParseTernaryExpr(ctx))
	{
		Lexeme *pos = ctx.currentLexeme;

		if(ctx.Consume(lex_set))
		{
			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynAssignment>()) SynAssignment(pos, ctx.Previous(), lhs, rhs);
		}
		else if(SynModifyAssignType modifyType = GetModifyAssignType(ctx.Peek()))
		{
			InplaceStr name = ctx.Consume();

			SynBase *rhs = ParseAssignment(ctx);

			if(!rhs)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '%.*s' operator", name.length(), name.begin);

				rhs = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			return new (ctx.get<SynModifyAssignment>()) SynModifyAssignment(pos, ctx.Previous(), modifyType, lhs, rhs);
		}

		return lhs;
	}

	return NULL;
}